

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O3

void __thiscall w3Interp::interp(w3Interp *this,w3Module *mod,w3Export *emain)

{
  pointer pwVar1;
  ulong uVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  w3ModuleInstance instance;
  w3ModuleInstance wStack_98;
  
  if (((mod == (w3Module *)0x0) || (emain == (w3Export *)0x0)) ||
     (emain->tag != w3ImportTag_Function)) {
    interp();
LAB_0011e57e:
    interp();
  }
  else {
    uVar2 = (ulong)(emain->field_4).function;
    pwVar1 = (mod->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(mod->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pwVar1 >> 3) *
            -0x3333333333333333;
    if (uVar3 < uVar2 || uVar3 - uVar2 == 0) goto LAB_0011e57e;
    lVar5 = (long)(mod->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(mod->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar4 = lVar5 * -0x71c71c71c71c71c7;
    if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
      if (uVar3 + lVar5 * 0x71c71c71c71c71c7 == 0) {
        this->module = mod;
        w3ModuleInstance::w3ModuleInstance(&wStack_98,mod);
        this->module_instance = &wStack_98;
        Invoke(this,pwVar1 + uVar2);
        std::vector<w3ExportInstance,_std::allocator<w3ExportInstance>_>::~vector
                  (&wStack_98.exports);
        if (wStack_98.globals.super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(wStack_98.globals.
                          super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)wStack_98.globals.
                                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)wStack_98.globals.
                                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (wStack_98.tables.super__Vector_base<w3TableAddr_*,_std::allocator<w3TableAddr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(wStack_98.tables.
                          super__Vector_base<w3TableAddr_*,_std::allocator<w3TableAddr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)wStack_98.tables.
                                super__Vector_base<w3TableAddr_*,_std::allocator<w3TableAddr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)wStack_98.tables.
                                super__Vector_base<w3TableAddr_*,_std::allocator<w3TableAddr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (wStack_98.funcs.super__Vector_base<w3FuncAddr_*,_std::allocator<w3FuncAddr_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(wStack_98.funcs.
                          super__Vector_base<w3FuncAddr_*,_std::allocator<w3FuncAddr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)wStack_98.funcs.
                                super__Vector_base<w3FuncAddr_*,_std::allocator<w3FuncAddr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)wStack_98.funcs.
                                super__Vector_base<w3FuncAddr_*,_std::allocator<w3FuncAddr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (wStack_98.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(wStack_98.memory.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)wStack_98.memory.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)wStack_98.memory.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      goto LAB_0011e588;
    }
  }
  interp();
LAB_0011e588:
  interp();
  w3ModuleInstance::~w3ModuleInstance(&wStack_98);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void interp (w3Module* mod, w3Export* emain = 0)
    {
        Assert (mod && emain && emain->tag == w3ExportTag_Function);
        Assert (emain->function < mod->functions.size ());
        Assert (emain->function < mod->code.size ());
        Assert (mod->functions.size () == mod->code.size ());

        w3Function& fmain = mod->functions [emain->function];
        //w3Code& cmain = mod->code [emain->function];

        // instantiate module
        this->module = mod;
        w3ModuleInstance instance (module);
        this->module_instance = &instance;

        // Simulate call to initial function.
        Invoke (fmain);
    }